

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testProcrustesImp<float>(void)

{
  bool bVar1;
  float a;
  double dVar2;
  double dVar3;
  Eulerd rot2;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *in_stack_00000298;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *in_stack_000002a0;
  Eulerd rot;
  size_t i_1;
  size_t numPoints;
  Rand48 random;
  float theta;
  size_t i;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> toPoints;
  vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> fromPoints;
  M44d m;
  M44d id;
  undefined4 in_stack_fffffffffffff908;
  float in_stack_fffffffffffff90c;
  Matrix44<double> *in_stack_fffffffffffff910;
  Matrix44<double> *in_stack_fffffffffffff920;
  Matrix44<double> *in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  float in_stack_fffffffffffff934;
  double in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff940;
  float in_stack_fffffffffffff944;
  float in_stack_fffffffffffff968;
  float in_stack_fffffffffffff96c;
  float in_stack_fffffffffffff970;
  float in_stack_fffffffffffff974;
  Vec3<float> local_680;
  Vec3<float> local_674 [5];
  M44d *in_stack_fffffffffffff9d0;
  Euler<double> *in_stack_fffffffffffffa38;
  Vec3<float> local_544 [9];
  Vec3<double> *in_stack_fffffffffffffb28;
  Matrix44<double> *in_stack_fffffffffffffb30;
  M44d *in_stack_fffffffffffffb90;
  M44d *in_stack_fffffffffffffbe0;
  Vec3<float> local_418;
  Vec3<float> local_40c;
  Vec3<float> local_400;
  Vec3<float> local_3f4;
  ulong local_3e8;
  ulong local_3e0;
  Vec3<float> local_3d0 [2];
  Vec3<float> local_3b8;
  float local_3ac;
  ulong local_3a8;
  Vec3<double> local_370;
  Vec3<double> local_358;
  Vec3<double> local_340;
  Vec3<double> local_328;
  Vec3<double> local_310;
  Vec3<double> local_2f8;
  Vec3<double> local_2e0;
  Vec3<double> local_2c8;
  Vec3<double> local_2b0;
  Vec3<double> local_298;
  Matrix44<double> local_280;
  Matrix44<double> local_200;
  Matrix44<double> local_180;
  Matrix44<double> local_100;
  Matrix44<double> local_80;
  
  Imath_2_5::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_80,(Vec3 *)0x0,(float *)0x0,0,false);
  Imath_2_5::Matrix44<double>::Matrix44(in_stack_fffffffffffff910);
  bVar1 = Imath_2_5::Matrix44<double>::operator==(&local_80,&local_100);
  if (!bVar1) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                  ,0x127,"void testProcrustesImp() [T = float]");
  }
  Imath_2_5::procrustesRotationAndTranslation<float>((Vec3 *)&local_180,(Vec3 *)0x0,0,false);
  Imath_2_5::Matrix44<double>::operator=(&local_80,&local_180);
  Imath_2_5::Matrix44<double>::Matrix44(in_stack_fffffffffffff910);
  bVar1 = Imath_2_5::Matrix44<double>::operator==(&local_80,&local_200);
  if (!bVar1) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                  ,300,"void testProcrustesImp() [T = float]");
  }
  Imath_2_5::Matrix44<double>::Matrix44(in_stack_fffffffffffff910);
  Imath_2_5::Matrix44<double>::makeIdentity(in_stack_fffffffffffff910);
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffbe0);
  Imath_2_5::Vec3<double>::Vec3(&local_298,3.0,5.0,-0.2);
  Imath_2_5::Matrix44<double>::translate<double>
            ((Matrix44<double> *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffbe0);
  Imath_2_5::Vec3<double>::Vec3(&local_2b0,3.141592653589793,0.0,0.0);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffbe0);
  Imath_2_5::Vec3<double>::Vec3(&local_2c8,0.0,0.7853981633974483,0.0);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffbe0);
  Imath_2_5::Vec3<double>::Vec3(&local_2e0,0.0,0.0,-2.356194490192345);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testTranslationRotationMatrix<float>(in_stack_fffffffffffffbe0);
  Imath_2_5::Matrix44<double>::makeIdentity(in_stack_fffffffffffff910);
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffb90);
  Imath_2_5::Vec3<double>::Vec3(&local_2f8,0.4,6.0,10.0);
  Imath_2_5::Matrix44<double>::translate<double>
            ((Matrix44<double> *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffb90);
  Imath_2_5::Vec3<double>::Vec3(&local_310,3.141592653589793,0.0,0.0);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffb90);
  Imath_2_5::Vec3<double>::Vec3(&local_328,0.0,0.7853981633974483,0.0);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffb90);
  Imath_2_5::Vec3<double>::Vec3(&local_340,0.0,0.0,-2.356194490192345);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffb90);
  Imath_2_5::Vec3<double>::Vec3(&local_358,2.0,2.0,2.0);
  Imath_2_5::Matrix44<double>::scale<double>
            (in_stack_fffffffffffff910,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffb90);
  Imath_2_5::Vec3<double>::Vec3(&local_370,0.01,0.01,0.01);
  Imath_2_5::Matrix44<double>::scale<double>
            (in_stack_fffffffffffff910,
             (Vec3<double> *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  testWithTranslateRotateAndScale<float>(in_stack_fffffffffffffb90);
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::vector
            ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x1736da);
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::vector
            ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x1736e7);
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::clear
            ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x1736f4);
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::clear
            ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x173701);
  for (local_3a8 = 0; local_3a8 < 4; local_3a8 = local_3a8 + 1) {
    in_stack_fffffffffffff96c = (float)(long)(local_3a8 * 2);
    in_stack_fffffffffffff970 =
         (float)(local_3a8 & 0x7fffffffffffffff) + (float)(local_3a8 & 0x7fffffffffffffff);
    if (-1 < (long)(local_3a8 * 2)) {
      in_stack_fffffffffffff970 = in_stack_fffffffffffff96c;
    }
    local_3ac = in_stack_fffffffffffff970 / 3.1415927;
    dVar2 = std::cos((double)(ulong)(uint)local_3ac);
    in_stack_fffffffffffff968 = SUB84(dVar2,0);
    dVar2 = std::sin((double)(ulong)(uint)local_3ac);
    Imath_2_5::Vec3<float>::Vec3(&local_3b8,in_stack_fffffffffffff968,SUB84(dVar2,0),0.0);
    std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::push_back
              ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
               in_stack_fffffffffffff910,
               (value_type *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
    dVar2 = cos((double)local_3ac + 1.0471975511965976);
    dVar3 = sin((double)local_3ac + 1.0471975511965976);
    Imath_2_5::Vec3<float>::Vec3(local_3d0,(float)dVar2,(float)dVar3,0.0);
    std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::push_back
              ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
               in_stack_fffffffffffff910,
               (value_type *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  }
  verifyProcrustes<float>(in_stack_000002a0,in_stack_00000298);
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)in_stack_fffffffffffff910,
             CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  for (local_3e0 = 1; local_3e0 < 10; local_3e0 = local_3e0 + 1) {
    std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::clear
              ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x1738ff)
    ;
    std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::clear
              ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)0x17390c)
    ;
    for (local_3e8 = 0; local_3e8 < local_3e0; local_3e8 = local_3e8 + 1) {
      dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x17393b);
      in_stack_fffffffffffff944 = (float)dVar2;
      dVar2 = Imath_2_5::Rand48::nextf((Rand48 *)0x173960);
      in_stack_fffffffffffff934 = (float)dVar2;
      in_stack_fffffffffffff938 = Imath_2_5::Rand48::nextf((Rand48 *)0x173985);
      Imath_2_5::Vec3<float>::Vec3
                (&local_3f4,in_stack_fffffffffffff944,in_stack_fffffffffffff934,
                 (float)in_stack_fffffffffffff938);
      std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::push_back
                ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
                 in_stack_fffffffffffff910,
                 (value_type *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
      in_stack_fffffffffffff928 = (Matrix44<double> *)Imath_2_5::Rand48::nextf((Rand48 *)0x1739d6);
      a = (float)(double)in_stack_fffffffffffff928;
      in_stack_fffffffffffff920 = (Matrix44<double> *)Imath_2_5::Rand48::nextf((Rand48 *)0x1739fb);
      in_stack_fffffffffffff90c = (float)(double)in_stack_fffffffffffff920;
      in_stack_fffffffffffff910 = (Matrix44<double> *)Imath_2_5::Rand48::nextf((Rand48 *)0x173a20);
      Imath_2_5::Vec3<float>::Vec3
                (&local_400,a,in_stack_fffffffffffff90c,(float)(double)in_stack_fffffffffffff910);
      std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::push_back
                ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
                 in_stack_fffffffffffff910,
                 (value_type *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
    }
  }
  verifyProcrustes<float>(in_stack_000002a0,in_stack_00000298);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff9d0);
  Imath_2_5::Vec3<float>::Vec3(&local_40c,3.0,4.0,1.0);
  Imath_2_5::Matrix44<double>::translate<float>
            ((Matrix44<double> *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff9d0);
  Imath_2_5::Vec3<float>::Vec3(&local_418,-10.0,2.0,1.0);
  Imath_2_5::Matrix44<double>::translate<float>
            ((Matrix44<double> *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff9d0);
  Imath_2_5::Euler<double>::Euler
            ((Euler<double> *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             in_stack_fffffffffffff938,
             (double)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (double)in_stack_fffffffffffff928,(Order)((ulong)in_stack_fffffffffffff920 >> 0x20),
             (InputLayout)in_stack_fffffffffffff920);
  Imath_2_5::Euler<double>::toMatrix44(in_stack_fffffffffffffa38);
  Imath_2_5::Matrix44<double>::operator*(in_stack_fffffffffffff928,in_stack_fffffffffffff920);
  Imath_2_5::Matrix44<double>::operator=(&local_280,(Matrix44<double> *)&stack0xfffffffffffffb48);
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff9d0);
  Imath_2_5::Vec3<float>::Vec3(local_544,1.5,6.4,2.0);
  Imath_2_5::Matrix44<double>::scale<float>
            (in_stack_fffffffffffff910,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff9d0);
  Imath_2_5::Euler<double>::Euler
            ((Euler<double> *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             in_stack_fffffffffffff938,
             (double)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
             (double)in_stack_fffffffffffff928,(Order)((ulong)in_stack_fffffffffffff920 >> 0x20),
             (InputLayout)in_stack_fffffffffffff920);
  Imath_2_5::Euler<double>::toMatrix44(in_stack_fffffffffffffa38);
  Imath_2_5::Matrix44<double>::operator*(in_stack_fffffffffffff928,in_stack_fffffffffffff920);
  Imath_2_5::Matrix44<double>::operator=(&local_280,(Matrix44<double> *)&stack0xfffffffffffffa18);
  Imath_2_5::Vec3<float>::Vec3(local_674,-1.0,1.0,1.0);
  Imath_2_5::Matrix44<double>::scale<float>
            (in_stack_fffffffffffff910,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff9d0);
  Imath_2_5::Vec3<float>::Vec3(&local_680,1.0,0.001,1.0);
  Imath_2_5::Matrix44<double>::scale<float>
            (in_stack_fffffffffffff910,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff9d0);
  Imath_2_5::Vec3<float>::Vec3((Vec3<float> *)&stack0xfffffffffffff974,1.0,1.0,0.0);
  Imath_2_5::Matrix44<double>::scale<float>
            (in_stack_fffffffffffff910,
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  testProcrustesWithMatrix<float>(in_stack_fffffffffffff9d0);
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::~vector
            ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
             in_stack_fffffffffffff920);
  std::vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_>::~vector
            ((vector<Imath_2_5::Vec3<float>,_std::allocator<Imath_2_5::Vec3<float>_>_> *)
             in_stack_fffffffffffff920);
  return;
}

Assistant:

void
testProcrustesImp ()
{
    // Test the empty case:
    IMATH_INTERNAL_NAMESPACE::M44d id = 
        procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                          (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                          (T*) 0,
                                          0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    id = procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                           (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                           0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    // First we'll test with a bunch of known translation/rotation matrices
    // to make sure we get back exactly the same points:
    IMATH_INTERNAL_NAMESPACE::M44d m;
    m.makeIdentity();
    testTranslationRotationMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(3.0, 5.0, -0.2));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testTranslationRotationMatrix<T> (m);
    
    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testTranslationRotationMatrix<T> (m);

    m.makeIdentity();
    testWithTranslateRotateAndScale<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(0.4, 6.0, 10.0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(2.0, 2.0, 2.0));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(0.01, 0.01, 0.01));
    testWithTranslateRotateAndScale<T> (m);

    // Now we'll test with some random point sets and verify
    // the various Procrustes properties:
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > toPoints;
    fromPoints.clear(); toPoints.clear();

    for (size_t i = 0; i < 4; ++i)
    {
        const T theta = T(2*i) / T(M_PI);
        fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta), sin(theta), 0));
        toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta + M_PI/3.0), sin(theta + M_PI/3.0), 0));
    }
    verifyProcrustes (fromPoints, toPoints);

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        fromPoints.clear(); toPoints.clear();
        for (size_t i = 0; i < numPoints; ++i)
        {
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
        }
    }
    verifyProcrustes (fromPoints, toPoints);

    // Test with some known matrices of varying degrees of quality:
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(3, 4, 1));
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-10, 2, 1));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot (M_PI/3.0, 3.0*M_PI/4.0, 0);
    m = m * rot.toMatrix44();
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1.5, 6.4, 2.0));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot2 (1.0, M_PI, M_PI/3.0);
    m = m * rot.toMatrix44();

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-1, 1, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 0.001, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 1, 0));
    testProcrustesWithMatrix<T> (m);
}